

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-blend.c
# Opt level: O0

void composition_solid_source_out(uint32_t *dest,int length,uint32_t color,uint32_t const_alpha)

{
  uint32_t uVar1;
  uint32_t uVar2;
  int local_28;
  uint32_t d;
  int i_1;
  uint32_t cia;
  int i;
  uint32_t const_alpha_local;
  uint32_t color_local;
  int length_local;
  uint32_t *dest_local;
  
  if (const_alpha == 0xff) {
    for (i_1 = 0; i_1 < length; i_1 = i_1 + 1) {
      uVar1 = BYTE_MUL(color,(dest[i_1] ^ 0xffffffff) >> 0x18);
      dest[i_1] = uVar1;
    }
  }
  else {
    uVar1 = BYTE_MUL(color,const_alpha);
    for (local_28 = 0; local_28 < length; local_28 = local_28 + 1) {
      uVar2 = INTERPOLATE_PIXEL(uVar1,(dest[local_28] ^ 0xffffffff) >> 0x18,dest[local_28],
                                0xff - const_alpha);
      dest[local_28] = uVar2;
    }
  }
  return;
}

Assistant:

static void composition_solid_source_out(uint32_t* dest, int length, uint32_t color, uint32_t const_alpha)
{
    if(const_alpha == 255) {
        for(int i = 0; i < length; i++) {
            dest[i] = BYTE_MUL(color, plutovg_alpha(~dest[i]));
        }
    } else {
        color = BYTE_MUL(color, const_alpha);
        uint32_t cia = 255 - const_alpha;
        for(int i = 0; i < length; i++) {
            uint32_t d = dest[i];
            dest[i] = INTERPOLATE_PIXEL(color, plutovg_alpha(~d), d, cia);
        }
    }
}